

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screen.cpp
# Opt level: O0

void __thiscall nesvis::Screen::draw(Screen *this,RenderWindow *window)

{
  int *this_00;
  undefined1 local_148 [8];
  Sprite sprite;
  RenderWindow *window_local;
  Screen *this_local;
  
  this_00 = &sprite.m_textureRect.width;
  sf::Rect<int>::Rect((Rect<int> *)this_00);
  sf::Texture::loadFromImage(&this->texture_,&this->image_,(IntRect *)this_00);
  sf::Sprite::Sprite((Sprite *)local_148);
  sf::Sprite::setTexture((Sprite *)local_148,&this->texture_,true);
  sf::Transformable::setScale((Transformable *)&sprite,this->scaling_,this->scaling_);
  sf::RenderTarget::draw
            (&window->super_RenderTarget,(Drawable *)local_148,
             (RenderStates *)sf::RenderStates::Default);
  sf::Sprite::~Sprite((Sprite *)local_148);
  return;
}

Assistant:

void Screen::draw(sf::RenderWindow &window) {
    texture_.loadFromImage(image_);
    sf::Sprite sprite;
    sprite.setTexture(texture_, true);
    sprite.setScale(scaling_, scaling_);

    window.draw(sprite);
}